

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O0

bool __thiscall btVoronoiSimplexSolver::updateClosestVectorAndPoints(btVoronoiSimplexSolver *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  btVoronoiSimplexSolver *in_RDI;
  btVector3 bVar4;
  bool hasSeperation;
  btVector3 *d;
  btVector3 *c_1;
  btVector3 *b_1;
  btVector3 *a_1;
  btVector3 p_2;
  btVector3 *c;
  btVector3 *b;
  btVector3 *a;
  btVector3 p_1;
  btScalar dotVV;
  btScalar t;
  btVector3 v;
  btVector3 diff;
  btVector3 p;
  btVector3 nearest;
  btVector3 *to;
  btVector3 *from;
  btUsageBitfield *in_stack_fffffffffffffc28;
  btUsageBitfield *usedVerts;
  btVoronoiSimplexSolver *in_stack_fffffffffffffc30;
  btVoronoiSimplexSolver *this_00;
  btVector3 *in_stack_fffffffffffffc38;
  btScalar *v2;
  btVector3 *in_stack_fffffffffffffc40;
  btScalar *v_00;
  btScalar local_340;
  btScalar local_33c;
  btScalar local_338;
  undefined8 local_334;
  undefined8 local_32c;
  undefined8 local_324;
  undefined8 local_31c;
  undefined8 local_314;
  undefined8 local_30c;
  undefined8 local_304;
  undefined8 local_2fc;
  undefined8 local_2f4;
  undefined8 local_2ec;
  undefined8 local_2e4;
  undefined8 local_2dc;
  undefined8 local_2d4;
  undefined8 local_2cc;
  undefined8 local_2c4;
  undefined8 uStack_2bc;
  undefined8 local_2b4;
  undefined8 local_2ac;
  undefined8 local_2a4;
  undefined8 local_29c;
  undefined8 local_294;
  undefined8 local_28c;
  btScalar local_284;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  btScalar local_21c;
  btScalar local_218;
  btScalar local_214;
  btVector3 local_210;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  btVector3 *local_150;
  btVector3 *local_148;
  btVector3 *local_140;
  btScalar local_138;
  btScalar local_134;
  btScalar local_130;
  btVector3 local_12c;
  undefined8 local_11c;
  undefined8 local_114;
  undefined8 local_10c;
  undefined8 local_104;
  undefined8 local_fc;
  undefined8 local_f4;
  undefined8 local_ec;
  undefined8 uStack_e4;
  undefined8 local_dc;
  undefined8 local_d4;
  undefined8 local_cc;
  undefined8 local_c4;
  undefined8 local_bc;
  undefined8 uStack_b4;
  undefined8 local_ac;
  undefined8 local_a4;
  btScalar local_9c [2];
  btScalar abStack_94 [2];
  btVector3 local_8c;
  btScalar local_7c;
  float local_78;
  btVector3 local_74;
  btVector3 local_64;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  btVector3 local_38;
  btVector3 *local_28;
  btVector3 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if ((in_RDI->m_needsUpdate & 1U) != 0) {
    btSubSimplexClosestResult::reset((btSubSimplexClosestResult *)in_stack_fffffffffffffc30);
    in_RDI->m_needsUpdate = false;
    iVar3 = numVertices(in_RDI);
    switch(iVar3) {
    case 0:
      in_RDI->m_cachedValidClosest = false;
      break;
    case 1:
      uVar1 = *(undefined8 *)(in_RDI->m_simplexPointsP[0].m_floats + 2);
      *(undefined8 *)(in_RDI->m_cachedP1).m_floats =
           *(undefined8 *)in_RDI->m_simplexPointsP[0].m_floats;
      *(undefined8 *)((in_RDI->m_cachedP1).m_floats + 2) = uVar1;
      uVar1 = *(undefined8 *)(in_RDI->m_simplexPointsQ[0].m_floats + 2);
      *(undefined8 *)(in_RDI->m_cachedP2).m_floats =
           *(undefined8 *)in_RDI->m_simplexPointsQ[0].m_floats;
      *(undefined8 *)((in_RDI->m_cachedP2).m_floats + 2) = uVar1;
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_10 = bVar4.m_floats._8_8_;
      local_18 = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedV).m_floats = local_18;
      *(undefined8 *)((in_RDI->m_cachedV).m_floats + 2) = local_10;
      btSubSimplexClosestResult::reset((btSubSimplexClosestResult *)in_stack_fffffffffffffc30);
      btSubSimplexClosestResult::setBarycentricCoordinates(&in_RDI->m_cachedBC,1.0,0.0,0.0,0.0);
      bVar2 = btSubSimplexClosestResult::isValid(&in_RDI->m_cachedBC);
      in_RDI->m_cachedValidClosest = bVar2;
      break;
    case 2:
      local_20 = in_RDI->m_simplexVectorW;
      local_28 = in_RDI->m_simplexVectorW + 1;
      btVector3::btVector3(&local_38);
      local_4c = 0.0;
      local_50 = 0.0;
      local_54 = 0.0;
      btVector3::btVector3(&local_48,&local_4c,&local_50,&local_54);
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_64.m_floats._8_8_ = bVar4.m_floats._8_8_;
      local_64.m_floats._0_8_ = bVar4.m_floats._0_8_;
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_74.m_floats._8_8_ = bVar4.m_floats._8_8_;
      local_74.m_floats._0_8_ = bVar4.m_floats._0_8_;
      local_78 = btVector3::dot(&local_74,&local_64);
      if (local_78 <= 0.0) {
        local_78 = 0.0;
        *(byte *)&(in_RDI->m_cachedBC).m_usedVertices =
             *(byte *)&(in_RDI->m_cachedBC).m_usedVertices & 0xfe | 1;
      }
      else {
        local_7c = btVector3::dot(&local_74,&local_74);
        if (local_7c <= local_78) {
          local_78 = 1.0;
          btVector3::operator-=(&local_64,&local_74);
          *(byte *)&(in_RDI->m_cachedBC).m_usedVertices =
               *(byte *)&(in_RDI->m_cachedBC).m_usedVertices & 0xfd | 2;
        }
        else {
          local_78 = local_78 / local_7c;
          bVar4 = ::operator*((btScalar *)in_stack_fffffffffffffc30,
                              (btVector3 *)in_stack_fffffffffffffc28);
          local_8c.m_floats._8_8_ = bVar4.m_floats._8_8_;
          local_8c.m_floats._0_8_ = bVar4.m_floats._0_8_;
          btVector3::operator-=(&local_64,&local_8c);
          *(byte *)&(in_RDI->m_cachedBC).m_usedVertices =
               *(byte *)&(in_RDI->m_cachedBC).m_usedVertices & 0xfe | 1;
          *(byte *)&(in_RDI->m_cachedBC).m_usedVertices =
               *(byte *)&(in_RDI->m_cachedBC).m_usedVertices & 0xfd | 2;
        }
      }
      btSubSimplexClosestResult::setBarycentricCoordinates
                (&in_RDI->m_cachedBC,1.0 - local_78,local_78,0.0,0.0);
      bVar4 = ::operator*((btScalar *)in_stack_fffffffffffffc30,
                          (btVector3 *)in_stack_fffffffffffffc28);
      local_a4 = bVar4.m_floats._8_8_;
      local_ac = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      abStack_94 = bVar4.m_floats._8_8_;
      local_9c = bVar4.m_floats._0_8_;
      local_38.m_floats._0_8_ = local_9c;
      local_38.m_floats._8_8_ = abStack_94;
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_d4 = bVar4.m_floats._8_8_;
      local_dc = bVar4.m_floats._0_8_;
      bVar4 = ::operator*((btScalar *)in_stack_fffffffffffffc30,
                          (btVector3 *)in_stack_fffffffffffffc28);
      local_c4 = bVar4.m_floats._8_8_;
      local_cc = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      uStack_b4 = bVar4.m_floats._8_8_;
      local_bc = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedP1).m_floats = local_bc;
      *(undefined8 *)((in_RDI->m_cachedP1).m_floats + 2) = uStack_b4;
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_104 = bVar4.m_floats._8_8_;
      local_10c = bVar4.m_floats._0_8_;
      bVar4 = ::operator*((btScalar *)in_stack_fffffffffffffc30,
                          (btVector3 *)in_stack_fffffffffffffc28);
      local_f4 = bVar4.m_floats._8_8_;
      local_fc = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      uStack_e4 = bVar4.m_floats._8_8_;
      local_ec = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedP2).m_floats = local_ec;
      *(undefined8 *)((in_RDI->m_cachedP2).m_floats + 2) = uStack_e4;
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_114 = bVar4.m_floats._8_8_;
      local_11c = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedV).m_floats = local_11c;
      *(undefined8 *)((in_RDI->m_cachedV).m_floats + 2) = local_114;
      reduceVertices(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      bVar2 = btSubSimplexClosestResult::isValid(&in_RDI->m_cachedBC);
      in_RDI->m_cachedValidClosest = bVar2;
      break;
    case 3:
      local_130 = 0.0;
      local_134 = 0.0;
      local_138 = 0.0;
      btVector3::btVector3(&local_12c,&local_130,&local_134,&local_138);
      local_140 = in_RDI->m_simplexVectorW;
      local_148 = in_RDI->m_simplexVectorW + 1;
      local_150 = in_RDI->m_simplexVectorW + 2;
      closestPtPointTriangle
                ((btVoronoiSimplexSolver *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (btSubSimplexClosestResult *)
                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
      local_178 = bVar4.m_floats._8_8_;
      local_180 = bVar4.m_floats._0_8_;
      bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
      local_188 = bVar4.m_floats._8_8_;
      local_190 = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_168 = bVar4.m_floats._8_8_;
      local_170 = bVar4.m_floats._0_8_;
      bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
      local_198 = bVar4.m_floats._8_8_;
      local_1a0 = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      uStack_158 = bVar4.m_floats._8_8_;
      local_160 = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedP1).m_floats = local_160;
      *(undefined8 *)((in_RDI->m_cachedP1).m_floats + 2) = uStack_158;
      bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
      local_1c8 = bVar4.m_floats._8_8_;
      local_1d0 = bVar4.m_floats._0_8_;
      bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
      local_1d8 = bVar4.m_floats._8_8_;
      local_1e0 = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_1b8 = bVar4.m_floats._8_8_;
      local_1c0 = bVar4.m_floats._0_8_;
      bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
      local_1e8 = bVar4.m_floats._8_8_;
      local_1f0 = bVar4.m_floats._0_8_;
      bVar4 = operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      uStack_1a8 = bVar4.m_floats._8_8_;
      local_1b0 = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedP2).m_floats = local_1b0;
      *(undefined8 *)((in_RDI->m_cachedP2).m_floats + 2) = uStack_1a8;
      bVar4 = operator-(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_1f8 = bVar4.m_floats._8_8_;
      local_200 = bVar4.m_floats._0_8_;
      *(undefined8 *)(in_RDI->m_cachedV).m_floats = local_200;
      *(undefined8 *)((in_RDI->m_cachedV).m_floats + 2) = local_1f8;
      reduceVertices(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      bVar2 = btSubSimplexClosestResult::isValid(&in_RDI->m_cachedBC);
      in_RDI->m_cachedValidClosest = bVar2;
      break;
    case 4:
      local_214 = 0.0;
      local_218 = 0.0;
      local_21c = 0.0;
      btVector3::btVector3(&local_210,&local_214,&local_218,&local_21c);
      usedVerts = (btUsageBitfield *)&in_RDI->m_cachedBC;
      bVar2 = closestPtPointTetrahedron
                        ((btVoronoiSimplexSolver *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (btSubSimplexClosestResult *)(in_RDI->m_simplexVectorW + 3));
      if (bVar2) {
        this_00 = (btVoronoiSimplexSolver *)(in_RDI->m_cachedBC).m_barycentricCoords;
        bVar4 = ::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38->m_floats);
        local_284 = bVar4.m_floats[0];
        v2 = (in_RDI->m_cachedBC).m_barycentricCoords + 1;
        bVar4 = ::operator*(in_stack_fffffffffffffc40,v2);
        local_28c = bVar4.m_floats._8_8_;
        local_294 = bVar4.m_floats._0_8_;
        operator+(in_stack_fffffffffffffc40,(btVector3 *)v2);
        v_00 = (in_RDI->m_cachedBC).m_barycentricCoords + 2;
        bVar4 = ::operator*((btVector3 *)v_00,v2);
        local_29c = bVar4.m_floats._8_8_;
        local_2a4 = bVar4.m_floats._0_8_;
        operator+((btVector3 *)v_00,(btVector3 *)v2);
        bVar4 = ::operator*((btVector3 *)v_00,v2);
        local_2ac = bVar4.m_floats._8_8_;
        local_2b4 = bVar4.m_floats._0_8_;
        bVar4 = operator+((btVector3 *)v_00,(btVector3 *)v2);
        *(long *)(in_RDI->m_cachedP1).m_floats = bVar4.m_floats._0_8_;
        *(long *)((in_RDI->m_cachedP1).m_floats + 2) = bVar4.m_floats._8_8_;
        bVar4 = ::operator*((btVector3 *)v_00,v2);
        local_2ec = bVar4.m_floats._8_8_;
        local_2f4 = bVar4.m_floats._0_8_;
        bVar4 = ::operator*((btVector3 *)v_00,v2);
        local_2fc = bVar4.m_floats._8_8_;
        local_304 = bVar4.m_floats._0_8_;
        bVar4 = operator+((btVector3 *)v_00,(btVector3 *)v2);
        local_2dc = bVar4.m_floats._8_8_;
        local_2e4 = bVar4.m_floats._0_8_;
        bVar4 = ::operator*((btVector3 *)v_00,v2);
        local_30c = bVar4.m_floats._8_8_;
        local_314 = bVar4.m_floats._0_8_;
        bVar4 = operator+((btVector3 *)v_00,(btVector3 *)v2);
        local_2cc = bVar4.m_floats._8_8_;
        local_2d4 = bVar4.m_floats._0_8_;
        bVar4 = ::operator*((btVector3 *)v_00,v2);
        local_31c = bVar4.m_floats._8_8_;
        local_324 = bVar4.m_floats._0_8_;
        bVar4 = operator+((btVector3 *)v_00,(btVector3 *)v2);
        uStack_2bc = bVar4.m_floats._8_8_;
        local_2c4 = bVar4.m_floats._0_8_;
        *(undefined8 *)(in_RDI->m_cachedP2).m_floats = local_2c4;
        *(undefined8 *)((in_RDI->m_cachedP2).m_floats + 2) = uStack_2bc;
        bVar4 = operator-((btVector3 *)v_00,(btVector3 *)v2);
        local_32c = bVar4.m_floats._8_8_;
        local_334 = bVar4.m_floats._0_8_;
        *(undefined8 *)(in_RDI->m_cachedV).m_floats = local_334;
        *(undefined8 *)((in_RDI->m_cachedV).m_floats + 2) = local_32c;
        reduceVertices(this_00,usedVerts);
        bVar2 = btSubSimplexClosestResult::isValid(&in_RDI->m_cachedBC);
        in_RDI->m_cachedValidClosest = bVar2;
      }
      else if (((in_RDI->m_cachedBC).m_degenerate & 1U) == 0) {
        in_RDI->m_cachedValidClosest = true;
        local_338 = 0.0;
        local_33c = 0.0;
        local_340 = 0.0;
        btVector3::setValue(&in_RDI->m_cachedV,&local_338,&local_33c,&local_340);
      }
      else {
        in_RDI->m_cachedValidClosest = false;
      }
      break;
    default:
      in_RDI->m_cachedValidClosest = false;
    }
  }
  return (bool)(in_RDI->m_cachedValidClosest & 1);
}

Assistant:

bool	btVoronoiSimplexSolver::updateClosestVectorAndPoints()
{
	
	if (m_needsUpdate)
	{
		m_cachedBC.reset();

		m_needsUpdate = false;

		switch (numVertices())
		{
		case 0:
				m_cachedValidClosest = false;
				break;
		case 1:
			{
				m_cachedP1 = m_simplexPointsP[0];
				m_cachedP2 = m_simplexPointsQ[0];
				m_cachedV = m_cachedP1-m_cachedP2; //== m_simplexVectorW[0]
				m_cachedBC.reset();
				m_cachedBC.setBarycentricCoordinates(btScalar(1.),btScalar(0.),btScalar(0.),btScalar(0.));
				m_cachedValidClosest = m_cachedBC.isValid();
				break;
			};
		case 2:
			{
			//closest point origin from line segment
					const btVector3& from = m_simplexVectorW[0];
					const btVector3& to = m_simplexVectorW[1];
					btVector3 nearest;

					btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
					btVector3 diff = p - from;
					btVector3 v = to - from;
					btScalar t = v.dot(diff);
					
					if (t > 0) {
						btScalar dotVV = v.dot(v);
						if (t < dotVV) {
							t /= dotVV;
							diff -= t*v;
							m_cachedBC.m_usedVertices.usedVertexA = true;
							m_cachedBC.m_usedVertices.usedVertexB = true;
						} else {
							t = 1;
							diff -= v;
							//reduce to 1 point
							m_cachedBC.m_usedVertices.usedVertexB = true;
						}
					} else
					{
						t = 0;
						//reduce to 1 point
						m_cachedBC.m_usedVertices.usedVertexA = true;
					}
					m_cachedBC.setBarycentricCoordinates(1-t,t);
					nearest = from + t*v;

					m_cachedP1 = m_simplexPointsP[0] + t * (m_simplexPointsP[1] - m_simplexPointsP[0]);
					m_cachedP2 = m_simplexPointsQ[0] + t * (m_simplexPointsQ[1] - m_simplexPointsQ[0]);
					m_cachedV = m_cachedP1 - m_cachedP2;
					
					reduceVertices(m_cachedBC.m_usedVertices);

					m_cachedValidClosest = m_cachedBC.isValid();
					break;
			}
		case 3: 
			{ 
				//closest point origin from triangle 
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.)); 

				const btVector3& a = m_simplexVectorW[0]; 
				const btVector3& b = m_simplexVectorW[1]; 
				const btVector3& c = m_simplexVectorW[2]; 

				closestPtPointTriangle(p,a,b,c,m_cachedBC); 
				m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedV = m_cachedP1-m_cachedP2; 

				reduceVertices (m_cachedBC.m_usedVertices); 
				m_cachedValidClosest = m_cachedBC.isValid(); 

				break; 
			}
		case 4:
			{

				
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
				
				const btVector3& a = m_simplexVectorW[0];
				const btVector3& b = m_simplexVectorW[1];
				const btVector3& c = m_simplexVectorW[2];
				const btVector3& d = m_simplexVectorW[3];

				bool hasSeperation = closestPtPointTetrahedron(p,a,b,c,d,m_cachedBC);

				if (hasSeperation)
				{

					m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsP[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsQ[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedV = m_cachedP1-m_cachedP2;
					reduceVertices (m_cachedBC.m_usedVertices);
				} else
				{
//					printf("sub distance got penetration\n");

					if (m_cachedBC.m_degenerate)
					{
						m_cachedValidClosest = false;
					} else
					{
						m_cachedValidClosest = true;
						//degenerate case == false, penetration = true + zero
						m_cachedV.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
					}
					break;
				}

				m_cachedValidClosest = m_cachedBC.isValid();

				//closest point origin from tetrahedron
				break;
			}
		default:
			{
				m_cachedValidClosest = false;
			}
		};
	}

	return m_cachedValidClosest;

}